

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

int hydro_hash_init(hydro_hash_state *state,char *ctx,uint8_t *key)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  void *in_RDI;
  size_t p;
  uint8_t block [64];
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined8 local_52;
  undefined1 auStackY_4a [2];
  undefined1 local_48;
  undefined7 local_47;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  
  memset(&local_58,0,0x40);
  local_58 = 4;
  local_57 = 0x6b;
  local_56 = 0x6d;
  local_55 = 0x61;
  local_54 = 99;
  local_53 = 8;
  mem_zero(auStackY_4a,0x32);
  local_52 = *in_RSI;
  if (in_RDX == (undefined8 *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = 0x20;
    local_47 = (undefined7)*in_RDX;
    in_stack_ffffffffffffffc0 = (undefined1)((ulong)*in_RDX >> 0x38);
    in_stack_ffffffffffffffc1 = (undefined7)in_RDX[1];
    in_stack_ffffffffffffffc8 = (undefined1)((ulong)in_RDX[1] >> 0x38);
    in_stack_ffffffffffffffc9 = (undefined7)in_RDX[2];
    in_stack_ffffffffffffffd0 = (undefined1)((ulong)in_RDX[2] >> 0x38);
    in_stack_ffffffffffffffd1 = (undefined7)in_RDX[3];
  }
  mem_zero(in_RDI,0x34);
  hydro_hash_update((hydro_hash_state *)
                    CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                    (void *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8),
                    CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0));
  return 0;
}

Assistant:

int
hydro_hash_init(hydro_hash_state *state, const char ctx[hydro_hash_CONTEXTBYTES],
                const uint8_t key[hydro_hash_KEYBYTES])
{
    uint8_t block[64] = { 4, 'k', 'm', 'a', 'c', 8 };
    size_t  p;

    COMPILER_ASSERT(hydro_hash_KEYBYTES <= sizeof block - gimli_RATE - 1);
    COMPILER_ASSERT(hydro_hash_CONTEXTBYTES == 8);
    mem_zero(block + 14, sizeof block - 14);
    memcpy(block + 6, ctx, 8);
    if (key != NULL) {
        block[gimli_RATE] = (uint8_t) hydro_hash_KEYBYTES;
        memcpy(block + gimli_RATE + 1, key, hydro_hash_KEYBYTES);
        p = (gimli_RATE + 1 + hydro_hash_KEYBYTES + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    } else {
        block[gimli_RATE] = (uint8_t) 0;
        p                 = (gimli_RATE + 1 + 0 + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    }
    mem_zero(state, sizeof *state);
    hydro_hash_update(state, block, p);

    return 0;
}